

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
cmConditionEvaluator::HandleLevel1
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *param_2,MessageType *param_3)

{
  cmExpandedCommandArgument *pcVar1;
  iterator iVar2;
  iterator iVar3;
  char *pcVar4;
  cmMakefile *pcVar5;
  size_t sVar6;
  bool bVar7;
  cmState *pcVar8;
  cmTest *pcVar9;
  cmValue cVar10;
  ostream *poVar11;
  string *psVar12;
  PolicyID id;
  TestFilePermissions permissions;
  size_t in_R8;
  static_string_view keyword;
  static_string_view keyword_00;
  static_string_view keyword_01;
  static_string_view keyword_02;
  static_string_view keyword_03;
  static_string_view keyword_04;
  static_string_view keyword_05;
  static_string_view keyword_06;
  static_string_view keyword_07;
  static_string_view keyword_08;
  static_string_view keyword_09;
  static_string_view keyword_10;
  static_string_view keyword_11;
  CurrentAndNextIter args;
  static_string_view prefix;
  static_string_view prefix_00;
  CurrentAndNextIter args_00;
  PolicyID pid;
  string local_1c8;
  _Any_data local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  iVar2._M_node =
       (newArgs->super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
       super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  pcVar4 = DAT_00a4dbf8;
  sVar6 = (anonymous_namespace)::keyTEST;
  do {
    if (iVar2._M_node == (_List_node_base *)newArgs) {
      (anonymous_namespace)::keyTEST = sVar6;
      DAT_00a4dbf8 = pcVar4;
      return true;
    }
    iVar3._M_node =
         (((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
          &(iVar2._M_node)->_M_next)->
         super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
         _M_impl._M_node.super__List_node_base._M_next;
    (anonymous_namespace)::keyTEST = sVar6;
    DAT_00a4dbf8 = pcVar4;
    if ((this->Policy64Status == WARN) &&
       (keyword_07.super_string_view._M_str = pcVar4, keyword_07.super_string_view._M_len = sVar6,
       bVar7 = IsKeyword(this,keyword_07,(cmExpandedCommandArgument *)(iVar2._M_node + 1)), bVar7))
    {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8._M_pod_data);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x40,id);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,local_1c8._M_dataplus._M_p,
                           local_1c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar4,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,
                 " will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                 ,0x7e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      pcVar5 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar5,AUTHOR_WARNING,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_pod_data);
      std::ios_base::~ios_base(local_138);
    }
    if (iVar3._M_node == (_List_node_base *)newArgs) goto LAB_0054160e;
    pcVar1 = (cmExpandedCommandArgument *)(iVar2._M_node + 1);
    keyword_08.super_string_view._M_str = DAT_00a4da68;
    keyword_08.super_string_view._M_len = (anonymous_namespace)::keyEXISTS;
    bVar7 = IsKeyword(this,keyword_08,pcVar1);
    if (bVar7) {
      psVar12 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                          ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
      bVar7 = cmsys::SystemTools::FileExists(psVar12);
      goto LAB_00541600;
    }
    keyword_09.super_string_view._M_str = DAT_00a4da78;
    keyword_09.super_string_view._M_len = (anonymous_namespace)::keyIS_READABLE;
    bVar7 = IsKeyword(this,keyword_09,pcVar1);
    if (bVar7) {
      psVar12 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                          ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
      permissions = 4;
LAB_005415f8:
      bVar7 = cmsys::SystemTools::TestFileAccess(psVar12,permissions);
LAB_00541600:
      args_00.next._M_node = iVar3._M_node;
      args_00.current._M_node = iVar2._M_node;
      cmArgumentList::ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
                (newArgs,bVar7,args_00);
    }
    else {
      keyword_10.super_string_view._M_str = DAT_00a4da88;
      keyword_10.super_string_view._M_len = (anonymous_namespace)::keyIS_WRITABLE;
      bVar7 = IsKeyword(this,keyword_10,pcVar1);
      if (bVar7) {
        psVar12 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                            ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
        permissions = 2;
        goto LAB_005415f8;
      }
      keyword_11.super_string_view._M_str = DAT_00a4da98;
      keyword_11.super_string_view._M_len = (anonymous_namespace)::keyIS_EXECUTABLE;
      bVar7 = IsKeyword(this,keyword_11,pcVar1);
      if (bVar7) {
        psVar12 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                            ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
        permissions = 1;
        goto LAB_005415f8;
      }
      keyword.super_string_view._M_str = DAT_00a4dae8;
      keyword.super_string_view._M_len = (anonymous_namespace)::keyIS_DIRECTORY;
      bVar7 = IsKeyword(this,keyword,pcVar1);
      if (bVar7) {
        psVar12 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                            ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
        bVar7 = cmsys::SystemTools::FileIsDirectory(psVar12);
        goto LAB_00541600;
      }
      keyword_00.super_string_view._M_str = DAT_00a4db08;
      keyword_00.super_string_view._M_len = (anonymous_namespace)::keyIS_SYMLINK;
      bVar7 = IsKeyword(this,keyword_00,pcVar1);
      if (bVar7) {
        psVar12 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                            ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
        bVar7 = cmsys::SystemTools::FileIsSymlink(psVar12);
        goto LAB_00541600;
      }
      keyword_01.super_string_view._M_str = DAT_00a4dad8;
      keyword_01.super_string_view._M_len = (anonymous_namespace)::keyIS_ABSOLUTE;
      bVar7 = IsKeyword(this,keyword_01,pcVar1);
      if (bVar7) {
        psVar12 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                            ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
        bVar7 = cmsys::SystemTools::FileIsFullPath(psVar12);
        goto LAB_00541600;
      }
      keyword_02.super_string_view._M_str = DAT_00a4da38;
      keyword_02.super_string_view._M_len = (anonymous_namespace)::keyCOMMAND;
      bVar7 = IsKeyword(this,keyword_02,pcVar1);
      if (!bVar7) {
        keyword_03.super_string_view._M_str = DAT_00a4db88;
        keyword_03.super_string_view._M_len = (anonymous_namespace)::keyPOLICY;
        bVar7 = IsKeyword(this,keyword_03,pcVar1);
        if (bVar7) {
          psVar12 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                              ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
          bVar7 = cmPolicies::GetPolicyID
                            ((psVar12->_M_dataplus)._M_p,(PolicyID *)local_1a8._M_pod_data);
        }
        else {
          keyword_04.super_string_view._M_str = DAT_00a4dbe8;
          keyword_04.super_string_view._M_len = (anonymous_namespace)::keyTARGET;
          bVar7 = IsKeyword(this,keyword_04,pcVar1);
          if (bVar7) {
            pcVar5 = this->Makefile;
            psVar12 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                                ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
            pcVar9 = (cmTest *)cmMakefile::FindTargetToUse(pcVar5,psVar12,false);
          }
          else {
            keyword_05.super_string_view._M_str = DAT_00a4da48;
            keyword_05.super_string_view._M_len = (anonymous_namespace)::keyDEFINED;
            bVar7 = IsKeyword(this,keyword_05,pcVar1);
            if (bVar7) {
              pcVar1 = (cmExpandedCommandArgument *)(iVar3._M_node + 1);
              psVar12 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar1);
              pcVar4 = (char *)psVar12->_M_string_length;
              prefix.super_string_view._M_str = pcVar4;
              prefix.super_string_view._M_len = (size_t)"ENV";
              bVar7 = anon_unknown.dwarf_22aa8c6::looksLikeSpecialVariable
                                ((anon_unknown_dwarf_22aa8c6 *)psVar12,(string *)0x3,prefix,in_R8);
              if (bVar7) {
                psVar12 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar1);
                std::__cxx11::string::substr((ulong)&local_1a8,(ulong)psVar12);
                bVar7 = cmsys::SystemTools::HasEnv((string *)&local_1a8);
              }
              else {
                prefix_00.super_string_view._M_str = pcVar4;
                prefix_00.super_string_view._M_len = (size_t)"CACHE";
                bVar7 = anon_unknown.dwarf_22aa8c6::looksLikeSpecialVariable
                                  ((anon_unknown_dwarf_22aa8c6 *)psVar12,(string *)0x5,prefix_00,
                                   in_R8);
                if (!bVar7) {
                  pcVar5 = this->Makefile;
                  psVar12 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar1);
                  bVar7 = cmMakefile::IsDefinitionSet(pcVar5,psVar12);
                  goto LAB_00541600;
                }
                psVar12 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar1);
                std::__cxx11::string::substr((ulong)&local_1a8,(ulong)psVar12);
                pcVar8 = cmMakefile::GetState(this->Makefile);
                cVar10 = cmState::GetCacheEntryValue(pcVar8,(string *)&local_1a8);
                bVar7 = cVar10.Value != (string *)0x0;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_unused._0_8_ != local_198) {
                operator_delete(local_1a8._M_unused._M_object,
                                (ulong)(local_198[0]._M_allocated_capacity + 1));
              }
              goto LAB_00541600;
            }
            keyword_06.super_string_view._M_str = DAT_00a4dbf8;
            keyword_06.super_string_view._M_len = (anonymous_namespace)::keyTEST;
            bVar7 = IsKeyword(this,keyword_06,pcVar1);
            if ((!bVar7) || (this->Policy64Status < NEW)) goto LAB_0054160e;
            pcVar5 = this->Makefile;
            psVar12 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                                ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
            pcVar9 = cmMakefile::GetTest(pcVar5,psVar12);
          }
          bVar7 = pcVar9 != (cmTest *)0x0;
        }
        goto LAB_00541600;
      }
      pcVar8 = cmMakefile::GetState(this->Makefile);
      psVar12 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                          ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
      cmState::GetCommand((Command *)&local_1a8,pcVar8,psVar12);
      args.next._M_node = iVar3._M_node;
      args.current._M_node = iVar2._M_node;
      cmArgumentList::ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
                (newArgs,(code *)local_198[0]._0_8_ != (code *)0x0,args);
      if ((code *)local_198[0]._0_8_ != (code *)0x0) {
        (*(code *)local_198[0]._0_8_)(&local_1a8,&local_1a8,3);
      }
    }
LAB_0054160e:
    iVar2._M_node =
         (((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
          &(iVar2._M_node)->_M_next)->
         super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
         _M_impl._M_node.super__List_node_base._M_next;
    pcVar4 = DAT_00a4dbf8;
    sVar6 = (anonymous_namespace)::keyTEST;
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel1(cmArgumentList& newArgs, std::string&,
                                        MessageType&)
{
  for (auto args = newArgs.make2ArgsIterator(); args.current != newArgs.end();
       args.advance(newArgs)) {

    auto policyCheck = [&, this](const cmPolicies::PolicyID id,
                                 const cmPolicies::PolicyStatus status,
                                 const cm::static_string_view kw) {
      if (status == cmPolicies::WARN && this->IsKeyword(kw, *args.current)) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(id) << "\n"
          << kw
          << " will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
    };

    // NOTE Checking policies for warnings are not require an access to the
    // next arg. Check them first!
    policyCheck(cmPolicies::CMP0064, this->Policy64Status, keyTEST);

    // NOTE Fail fast: All the predicates below require the next arg to be
    // valid
    if (args.next == newArgs.end()) {
      continue;
    }

    // does a file exist
    if (this->IsKeyword(keyEXISTS, *args.current)) {
      newArgs.ReduceOneArg(cmSystemTools::FileExists(args.next->GetValue()),
                           args);
    }
    // check if a file is readable
    else if (this->IsKeyword(keyIS_READABLE, *args.current)) {
      newArgs.ReduceOneArg(cmSystemTools::TestFileAccess(
                             args.next->GetValue(), cmsys::TEST_FILE_READ),
                           args);
    }
    // check if a file is writable
    else if (this->IsKeyword(keyIS_WRITABLE, *args.current)) {
      newArgs.ReduceOneArg(cmSystemTools::TestFileAccess(
                             args.next->GetValue(), cmsys::TEST_FILE_WRITE),
                           args);
    }
    // check if a file is executable
    else if (this->IsKeyword(keyIS_EXECUTABLE, *args.current)) {
      newArgs.ReduceOneArg(cmSystemTools::TestFileAccess(
                             args.next->GetValue(), cmsys::TEST_FILE_EXECUTE),
                           args);
    }
    // does a directory with this name exist
    else if (this->IsKeyword(keyIS_DIRECTORY, *args.current)) {
      newArgs.ReduceOneArg(
        cmSystemTools::FileIsDirectory(args.next->GetValue()), args);
    }
    // does a symlink with this name exist
    else if (this->IsKeyword(keyIS_SYMLINK, *args.current)) {
      newArgs.ReduceOneArg(cmSystemTools::FileIsSymlink(args.next->GetValue()),
                           args);
    }
    // is the given path an absolute path ?
    else if (this->IsKeyword(keyIS_ABSOLUTE, *args.current)) {
      newArgs.ReduceOneArg(
        cmSystemTools::FileIsFullPath(args.next->GetValue()), args);
    }
    // does a command exist
    else if (this->IsKeyword(keyCOMMAND, *args.current)) {
      newArgs.ReduceOneArg(
        static_cast<bool>(
          this->Makefile.GetState()->GetCommand(args.next->GetValue())),
        args);
    }
    // does a policy exist
    else if (this->IsKeyword(keyPOLICY, *args.current)) {
      cmPolicies::PolicyID pid;
      newArgs.ReduceOneArg(
        cmPolicies::GetPolicyID(args.next->GetValue().c_str(), pid), args);
    }
    // does a target exist
    else if (this->IsKeyword(keyTARGET, *args.current)) {
      newArgs.ReduceOneArg(static_cast<bool>(this->Makefile.FindTargetToUse(
                             args.next->GetValue())),
                           args);
    }
    // is a variable defined
    else if (this->IsKeyword(keyDEFINED, *args.current)) {
      const auto& var = args.next->GetValue();
      const auto varNameLen = var.size();

      auto result = false;
      if (looksLikeSpecialVariable(var, "ENV"_s, varNameLen)) {
        const auto env = args.next->GetValue().substr(4, varNameLen - 5);
        result = cmSystemTools::HasEnv(env);
      }

      else if (looksLikeSpecialVariable(var, "CACHE"_s, varNameLen)) {
        const auto cache = args.next->GetValue().substr(6, varNameLen - 7);
        result = static_cast<bool>(
          this->Makefile.GetState()->GetCacheEntryValue(cache));
      }

      else {
        result = this->Makefile.IsDefinitionSet(args.next->GetValue());
      }
      newArgs.ReduceOneArg(result, args);
    }
    // does a test exist
    else if (this->IsKeyword(keyTEST, *args.current)) {
      if (this->Policy64Status == cmPolicies::OLD ||
          this->Policy64Status == cmPolicies::WARN) {
        continue;
      }
      newArgs.ReduceOneArg(
        static_cast<bool>(this->Makefile.GetTest(args.next->GetValue())),
        args);
    }
  }
  return true;
}